

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRepr.c
# Opt level: O0

void Aig_ManReprStart(Aig_Man_t *p,int nIdMax)

{
  int iVar1;
  Aig_Obj_t **ppAVar2;
  int nIdMax_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ManBufNum(p);
  if (iVar1 != 0) {
    __assert_fail("Aig_ManBufNum(p) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRepr.c"
                  ,0x2f,"void Aig_ManReprStart(Aig_Man_t *, int)");
  }
  if (p->pReprs == (Aig_Obj_t **)0x0) {
    p->nReprsAlloc = nIdMax;
    ppAVar2 = (Aig_Obj_t **)malloc((long)p->nReprsAlloc << 3);
    p->pReprs = ppAVar2;
    memset(p->pReprs,0,(long)p->nReprsAlloc << 3);
    return;
  }
  __assert_fail("p->pReprs == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRepr.c"
                ,0x30,"void Aig_ManReprStart(Aig_Man_t *, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Starts the array of representatives.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Aig_ManReprStart( Aig_Man_t * p, int nIdMax )
{
    assert( Aig_ManBufNum(p) == 0 );
    assert( p->pReprs == NULL );
    p->nReprsAlloc = nIdMax;
    p->pReprs = ABC_ALLOC( Aig_Obj_t *, p->nReprsAlloc );
    memset( p->pReprs, 0, sizeof(Aig_Obj_t *) * p->nReprsAlloc );
}